

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderPassBase<Diligent::EngineGLImplTraits>::ReserveSpace
          (RenderPassBase<Diligent::EngineGLImplTraits> *this,RenderPassDesc *Desc,
          FixedLinearAllocator *MemPool)

{
  SubpassDesc *pSVar1;
  ulong uVar2;
  long lVar3;
  
  FixedLinearAllocator::AddSpace
            (MemPool,(ulong)Desc->SubpassCount * (ulong)Desc->AttachmentCount * 4,4);
  FixedLinearAllocator::AddSpace(MemPool,(ulong)Desc->AttachmentCount << 3,4);
  FixedLinearAllocator::AddSpace(MemPool,(ulong)Desc->AttachmentCount << 4,4);
  FixedLinearAllocator::AddSpace(MemPool,(ulong)Desc->SubpassCount * 0x48,8);
  if (Desc->SubpassCount != 0) {
    lVar3 = 0x40;
    uVar2 = 0;
    do {
      pSVar1 = Desc->pSubpasses;
      FixedLinearAllocator::AddSpace(MemPool,(ulong)*(uint *)((long)pSVar1 + lVar3 + -0x40) << 3,4);
      FixedLinearAllocator::AddSpace(MemPool,(ulong)*(uint *)((long)pSVar1 + lVar3 + -0x30) << 3,4);
      if (*(long *)((long)pSVar1 + lVar3 + -0x20) != 0) {
        FixedLinearAllocator::AddSpace
                  (MemPool,(ulong)*(uint *)((long)pSVar1 + lVar3 + -0x30) << 3,4);
      }
      if (*(long *)((long)pSVar1 + lVar3 + -0x18) != 0) {
        FixedLinearAllocator::AddSpace(MemPool,8,4);
      }
      FixedLinearAllocator::AddSpace(MemPool,(ulong)*(uint *)((long)pSVar1 + lVar3 + -0x10) << 2,4);
      if (*(long *)((long)&pSVar1->InputAttachmentCount + lVar3) != 0) {
        FixedLinearAllocator::AddSpace(MemPool,0x10,4);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (uVar2 < Desc->SubpassCount);
  }
  FixedLinearAllocator::AddSpace(MemPool,(ulong)Desc->DependencyCount * 0x18,4);
  return;
}

Assistant:

void ReserveSpace(const RenderPassDesc& Desc, FixedLinearAllocator& MemPool) const
    {
        MemPool.AddSpace<RESOURCE_STATE>(size_t{Desc.AttachmentCount} * size_t{Desc.SubpassCount}); // m_AttachmentStates
        MemPool.AddSpace<std::pair<Uint32, Uint32>>(Desc.AttachmentCount);                          // m_AttachmentFirstLastUse

        MemPool.AddSpace<RenderPassAttachmentDesc>(Desc.AttachmentCount); // Desc.pAttachments
        MemPool.AddSpace<SubpassDesc>(Desc.SubpassCount);                 // Desc.pSubpasses

        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& SrcSubpass = Desc.pSubpasses[subpass];

            MemPool.AddSpace<AttachmentReference>(SrcSubpass.InputAttachmentCount);        // Subpass.pInputAttachments
            MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pRenderTargetAttachments

            if (SrcSubpass.pResolveAttachments != nullptr)
                MemPool.AddSpace<AttachmentReference>(SrcSubpass.RenderTargetAttachmentCount); // Subpass.pResolveAttachments

            if (SrcSubpass.pDepthStencilAttachment != nullptr)
                MemPool.AddSpace<AttachmentReference>(1); // Subpass.pDepthStencilAttachment

            MemPool.AddSpace<Uint32>(SrcSubpass.PreserveAttachmentCount); // Subpass.pPreserveAttachments

            if (SrcSubpass.pShadingRateAttachment != nullptr)
                MemPool.AddSpace<ShadingRateAttachment>(1); // Subpass.pShadingRateAttachment
        }

        MemPool.AddSpace<SubpassDependencyDesc>(Desc.DependencyCount); // Desc.pDependencies
    }